

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

Vec_Int_t * Acec_TreeCarryMap(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  
  iVar1 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  iVar7 = vBoxes->nSize;
  if (0 < (long)iVar7) {
    pVVar4 = vBoxes->pArray;
    lVar8 = 0;
    do {
      if (0 < pVVar4[lVar8].nSize) {
        piVar5 = pVVar4[lVar8].pArray;
        lVar9 = 0;
        do {
          iVar2 = piVar5[lVar9];
          if ((iVar2 < 0) || (uVar10 = iVar2 * 6 + 4, vAdds->nSize <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar3 = vAdds->pArray[uVar10];
          if (((long)iVar3 < 0) || (iVar1 <= iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar3] = iVar2;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar4[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar7);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, Box;
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            Vec_IntWriteEntry( vMap, Vec_IntEntry(vAdds, 6*Box+4), Box );
    return vMap;
}